

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O0

void vli_mmod_fast_secp256r1(uint *result,uint *product)

{
  cmpresult_t cVar1;
  tc_uECC_word_t tVar2;
  tc_uECC_word_t tVar3;
  tc_uECC_word_t tVar4;
  tc_uECC_word_t tVar5;
  tc_uECC_word_t tVar6;
  tc_uECC_word_t tVar7;
  tc_uECC_word_t tVar8;
  tc_uECC_word_t tVar9;
  tc_uECC_word_t tVar10;
  tc_uECC_word_t tVar11;
  bool bVar12;
  int local_3c;
  tc_uECC_word_t local_38;
  int carry;
  uint tmp [8];
  uint *product_local;
  uint *result_local;
  
  tmp._24_8_ = product;
  tc_uECC_vli_set(result,product,'\b');
  tmp[0] = 0;
  carry = 0;
  local_38 = 0;
  tmp[1] = *(uint *)(tmp._24_8_ + 0x2c);
  tmp[2] = *(uint *)(tmp._24_8_ + 0x30);
  tmp[3] = *(uint *)(tmp._24_8_ + 0x34);
  tmp[4] = *(uint *)(tmp._24_8_ + 0x38);
  tmp[5] = *(uint *)(tmp._24_8_ + 0x3c);
  tVar2 = tc_uECC_vli_add(&local_38,&local_38,&local_38,'\b');
  tVar3 = tc_uECC_vli_add(result,result,&local_38,'\b');
  tmp[1] = *(uint *)(tmp._24_8_ + 0x30);
  tmp[2] = *(uint *)(tmp._24_8_ + 0x34);
  tmp[3] = *(uint *)(tmp._24_8_ + 0x38);
  tmp[4] = *(uint *)(tmp._24_8_ + 0x3c);
  tmp[5] = 0;
  tVar4 = tc_uECC_vli_add(&local_38,&local_38,&local_38,'\b');
  tVar5 = tc_uECC_vli_add(result,result,&local_38,'\b');
  local_38 = *(tc_uECC_word_t *)(tmp._24_8_ + 0x20);
  carry = *(int *)(tmp._24_8_ + 0x24);
  tmp[0] = *(uint *)(tmp._24_8_ + 0x28);
  tmp[3] = 0;
  tmp[2] = 0;
  tmp[1] = 0;
  tmp[4] = *(uint *)(tmp._24_8_ + 0x38);
  tmp[5] = *(uint *)(tmp._24_8_ + 0x3c);
  tVar6 = tc_uECC_vli_add(result,result,&local_38,'\b');
  local_38 = *(tc_uECC_word_t *)(tmp._24_8_ + 0x24);
  carry = *(int *)(tmp._24_8_ + 0x28);
  tmp[0] = *(uint *)(tmp._24_8_ + 0x2c);
  tmp[1] = *(uint *)(tmp._24_8_ + 0x34);
  tmp[2] = *(uint *)(tmp._24_8_ + 0x38);
  tmp[3] = *(uint *)(tmp._24_8_ + 0x3c);
  tmp[4] = *(uint *)(tmp._24_8_ + 0x34);
  tmp[5] = *(uint *)(tmp._24_8_ + 0x20);
  tVar7 = tc_uECC_vli_add(result,result,&local_38,'\b');
  local_38 = *(tc_uECC_word_t *)(tmp._24_8_ + 0x2c);
  carry = *(int *)(tmp._24_8_ + 0x30);
  tmp[0] = *(uint *)(tmp._24_8_ + 0x34);
  tmp[3] = 0;
  tmp[2] = 0;
  tmp[1] = 0;
  tmp[4] = *(uint *)(tmp._24_8_ + 0x20);
  tmp[5] = *(uint *)(tmp._24_8_ + 0x28);
  tVar8 = tc_uECC_vli_sub(result,result,&local_38,'\b');
  local_38 = *(tc_uECC_word_t *)(tmp._24_8_ + 0x30);
  carry = *(int *)(tmp._24_8_ + 0x34);
  tmp[0] = *(uint *)(tmp._24_8_ + 0x38);
  tmp[1] = *(uint *)(tmp._24_8_ + 0x3c);
  tmp[3] = 0;
  tmp[2] = 0;
  tmp[4] = *(uint *)(tmp._24_8_ + 0x24);
  tmp[5] = *(uint *)(tmp._24_8_ + 0x2c);
  tVar9 = tc_uECC_vli_sub(result,result,&local_38,'\b');
  local_38 = *(tc_uECC_word_t *)(tmp._24_8_ + 0x34);
  carry = *(int *)(tmp._24_8_ + 0x38);
  tmp[0] = *(uint *)(tmp._24_8_ + 0x3c);
  tmp[1] = *(uint *)(tmp._24_8_ + 0x20);
  tmp[2] = *(uint *)(tmp._24_8_ + 0x24);
  tmp[3] = *(uint *)(tmp._24_8_ + 0x28);
  tmp[4] = 0;
  tmp[5] = *(uint *)(tmp._24_8_ + 0x30);
  tVar10 = tc_uECC_vli_sub(result,result,&local_38,'\b');
  local_38 = *(tc_uECC_word_t *)(tmp._24_8_ + 0x38);
  carry = *(int *)(tmp._24_8_ + 0x3c);
  tmp[0] = 0;
  tmp[1] = *(uint *)(tmp._24_8_ + 0x24);
  tmp[2] = *(uint *)(tmp._24_8_ + 0x28);
  tmp[3] = *(uint *)(tmp._24_8_ + 0x2c);
  tmp[4] = 0;
  tmp[5] = *(uint *)(tmp._24_8_ + 0x34);
  tVar11 = tc_uECC_vli_sub(result,result,&local_38,'\b');
  local_3c = ((((tVar7 + tVar6 + tVar5 + tVar4 + tVar3 + tVar2) - tVar8) - tVar9) - tVar10) - tVar11
  ;
  if (local_3c < 0) {
    do {
      tVar2 = tc_uECC_vli_add(result,result,curve_secp256r1.p,'\b');
      local_3c = tVar2 + local_3c;
    } while (local_3c < 0);
  }
  else {
    while( true ) {
      bVar12 = true;
      if (local_3c == 0) {
        cVar1 = tc_uECC_vli_cmp_unsafe(curve_secp256r1.p,result,'\b');
        bVar12 = cVar1 != '\x01';
      }
      if (!bVar12) break;
      tVar2 = tc_uECC_vli_sub(result,result,curve_secp256r1.p,'\b');
      local_3c = local_3c - tVar2;
    }
  }
  return;
}

Assistant:

void vli_mmod_fast_secp256r1(unsigned int *result, unsigned int*product)
{
	unsigned int tmp[NUM_ECC_WORDS];
	int carry;

	/* t */
	tc_uECC_vli_set(result, product, NUM_ECC_WORDS);

	/* s1 */
	tmp[0] = tmp[1] = tmp[2] = 0;
	tmp[3] = product[11];
	tmp[4] = product[12];
	tmp[5] = product[13];
	tmp[6] = product[14];
	tmp[7] = product[15];
	carry = tc_uECC_vli_add(tmp, tmp, tmp, NUM_ECC_WORDS);
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s2 */
	tmp[3] = product[12];
	tmp[4] = product[13];
	tmp[5] = product[14];
	tmp[6] = product[15];
	tmp[7] = 0;
	carry += tc_uECC_vli_add(tmp, tmp, tmp, NUM_ECC_WORDS);
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s3 */
	tmp[0] = product[8];
	tmp[1] = product[9];
	tmp[2] = product[10];
	tmp[3] = tmp[4] = tmp[5] = 0;
	tmp[6] = product[14];
	tmp[7] = product[15];
  	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* s4 */
	tmp[0] = product[9];
	tmp[1] = product[10];
	tmp[2] = product[11];
	tmp[3] = product[13];
	tmp[4] = product[14];
	tmp[5] = product[15];
	tmp[6] = product[13];
	tmp[7] = product[8];
	carry += tc_uECC_vli_add(result, result, tmp, NUM_ECC_WORDS);

	/* d1 */
	tmp[0] = product[11];
	tmp[1] = product[12];
	tmp[2] = product[13];
	tmp[3] = tmp[4] = tmp[5] = 0;
	tmp[6] = product[8];
	tmp[7] = product[10];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d2 */
	tmp[0] = product[12];
	tmp[1] = product[13];
	tmp[2] = product[14];
	tmp[3] = product[15];
	tmp[4] = tmp[5] = 0;
	tmp[6] = product[9];
	tmp[7] = product[11];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d3 */
	tmp[0] = product[13];
	tmp[1] = product[14];
	tmp[2] = product[15];
	tmp[3] = product[8];
	tmp[4] = product[9];
	tmp[5] = product[10];
	tmp[6] = 0;
	tmp[7] = product[12];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	/* d4 */
	tmp[0] = product[14];
	tmp[1] = product[15];
	tmp[2] = 0;
	tmp[3] = product[9];
	tmp[4] = product[10];
	tmp[5] = product[11];
	tmp[6] = 0;
	tmp[7] = product[13];
	carry -= tc_uECC_vli_sub(result, result, tmp, NUM_ECC_WORDS);

	if (carry < 0) {
		do {
			carry += tc_uECC_vli_add(result, result, curve_secp256r1.p, NUM_ECC_WORDS);
		}
		while (carry < 0);
	} else  {
		while (carry ||
		       tc_uECC_vli_cmp_unsafe(curve_secp256r1.p, result, NUM_ECC_WORDS) != 1) {
			carry -= tc_uECC_vli_sub(result, result, curve_secp256r1.p, NUM_ECC_WORDS);
		}
	}
}